

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkCheckConstraints(ARKodeMem ark_mem,int *constrfails,int *nflag)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  int iVar3;
  int iVar4;
  double dVar5;
  sunrealtype sVar6;
  
  p_Var1 = ark_mem->tempv4;
  p_Var2 = ark_mem->tempv3;
  iVar3 = N_VConstrMask(ark_mem->constraints,ark_mem->ycur,p_Var1);
  iVar4 = 0;
  if (iVar3 == 0) {
    ark_mem->nconstrfails = ark_mem->nconstrfails + 1;
    iVar3 = *constrfails;
    *constrfails = iVar3 + 1;
    iVar4 = -0x13;
    if (((iVar3 + 1 != ark_mem->maxconstrfails) && (ark_mem->fixedstep == 0)) &&
       (ark_mem->hmin * 1.000001 < ABS(ark_mem->h))) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->yn,ark_mem->ycur,p_Var2);
      N_VProd(p_Var1,p_Var2,p_Var2);
      dVar5 = (double)N_VMinQuotient(ark_mem->yn,p_Var2);
      sVar6 = dVar5 * 0.9;
      if (sVar6 <= 0.1) {
        sVar6 = 0.1;
      }
      ark_mem->eta = sVar6;
      *nflag = 7;
      iVar4 = 10;
    }
  }
  return iVar4;
}

Assistant:

int arkCheckConstraints(ARKodeMem ark_mem, int* constrfails, int* nflag)
{
  sunbooleantype constraintsPassed;
  N_Vector mm  = ark_mem->tempv4;
  N_Vector tmp = ark_mem->tempv3;

  /* Check constraints and get mask vector mm for where constraints failed */
  constraintsPassed = N_VConstrMask(ark_mem->constraints, ark_mem->ycur, mm);
  if (constraintsPassed) { return (ARK_SUCCESS); }

  /* Constraints not met */

  /* Update total fails and fails in current step */
  ark_mem->nconstrfails++;
  (*constrfails)++;

  /* Return with error if reached max fails in a step */
  if (*constrfails == ark_mem->maxconstrfails) { return (ARK_CONSTR_FAIL); }

  /* Return with error if using fixed step sizes */
  if (ark_mem->fixedstep) { return (ARK_CONSTR_FAIL); }

  /* Return with error if |h| == hmin */
  if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
  {
    return (ARK_CONSTR_FAIL);
  }

  /* Reduce h by computing eta = h'/h */
  N_VLinearSum(ONE, ark_mem->yn, -ONE, ark_mem->ycur, tmp);
  N_VProd(mm, tmp, tmp);
  ark_mem->eta = SUN_RCONST(0.9) * N_VMinQuotient(ark_mem->yn, tmp);
  ark_mem->eta = SUNMAX(ark_mem->eta, TENTH);

  /* Signal for Jacobian/preconditioner setup */
  *nflag = PREV_CONV_FAIL;

  /* Return to reattempt the step */
  return (CONSTR_RECVR);
}